

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parse_line(int nargs,char **args)

{
  char *s;
  uint uVar1;
  long lVar2;
  
  s = *args;
  uVar1 = lookup_keyword(s);
  printf("%s(%d)",s,(ulong)uVar1);
  for (lVar2 = 1; lVar2 < nargs; lVar2 = lVar2 + 1) {
    printf(" \'%s\'",args[lVar2]);
  }
  putchar(10);
  return;
}

Assistant:

void parse_line(int nargs, char **args)
{
    int n;
    int id = lookup_keyword(args[0]);
    printf("%s(%d)", args[0], id);
    for (n = 1; n < nargs; n++) {
        printf(" '%s'", args[n]);
    }
    printf("\n");
}